

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

int lws_mqtt_bindata_cmp(lws_mqtt_str_t *bd1,lws_mqtt_str_t *bd2)

{
  lws_mqtt_str_t *bd2_local;
  lws_mqtt_str_t *bd1_local;
  
  if (bd1->len == bd2->len) {
    if ((bd1->buf != (uint8_t *)0x0) == (bd2->buf != (uint8_t *)0x0)) {
      if ((bd1->buf == (uint8_t *)0x0) && (bd2->buf == (uint8_t *)0x0)) {
        bd1_local._4_4_ = 0;
      }
      else {
        bd1_local._4_4_ = memcmp(bd1->buf,bd2->buf,(ulong)bd1->len);
      }
    }
    else {
      bd1_local._4_4_ = 1;
    }
  }
  else {
    bd1_local._4_4_ = 1;
  }
  return bd1_local._4_4_;
}

Assistant:

int
lws_mqtt_bindata_cmp(const lws_mqtt_str_t *bd1,
		     const lws_mqtt_str_t *bd2)
{
	if (bd1->len != bd2->len)
		return 1;

	if (!!bd1->buf != !!bd2->buf)
		return 1;

	if (!bd1->buf && !bd2->buf)
		return 0;

	return memcmp(bd1->buf, bd2->buf, bd1->len);
}